

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QServ.cpp
# Opt level: O2

bool __thiscall server::QServ::handleTextCommands(QServ *this,clientinfo *ci,char *text)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  char *text_00;
  int cn;
  char *pcVar6;
  long lVar7;
  bool bVar8;
  char *args [20];
  char ftb [1024];
  char fulltext [1024];
  
  this->m_sender = ci->clientnum;
  clientinfo::operator=((clientinfo *)m_lastCI,ci);
  memset(ftb,0,0x400);
  strcpy(ftb,text);
  pcVar6 = this->m_fulltext;
  strcpy(pcVar6,ftb);
  if (*text == this->m_cmdprefix) {
    text_00 = " ";
    pcVar2 = strtok(text," ");
    lVar7 = 0;
    while (pcVar2 != (char *)0x0) {
      args[lVar7] = pcVar2;
      text_00 = " ";
      pcVar2 = strtok((char *)0x0," ");
      lVar7 = lVar7 + 1;
    }
    uVar1 = getCommand(this,text_00,args);
    pcVar2 = colorname(ci);
    out(2,"%s issued: %s",pcVar2,pcVar6);
    if ((int)uVar1 < 0) {
      cn = ci->clientnum;
      pcVar6 = "\f3Error: Command not found. Use \f2\"#help\" \f3for a list of commands.";
    }
    else {
      sVar3 = strlen(ftb);
      for (lVar5 = 0; sVar3 + 1 != lVar5; lVar5 = lVar5 + 1) {
        sVar4 = strlen(args[0]);
        fulltext[lVar5] = ftb[lVar5 + 1 + sVar4];
      }
      strcpy(pcVar6,fulltext);
      if (this->m_command[uVar1].priv <= ci->privilege) {
        bVar8 = true;
        if (this->m_command[uVar1].hasargs == true) {
          bVar8 = this->m_command[uVar1].args == (int)lVar7;
        }
        this->m_lastSA = bVar8;
        (*this->m_command[uVar1].func)(uVar1,args,(int)lVar7);
        return false;
      }
      cn = ci->clientnum;
      pcVar6 = "\f3Insufficient permission";
    }
    sendf(cn,1,"ris",0x23,pcVar6);
  }
  else {
    sVar3 = strlen(ftb);
    if ((sVar3 < 0x400) && (bVar8 = ircBot::isConnected(&irc), bVar8)) {
      ircBot::speak(&irc,"%s(%d): %s\r\n",ci->name,(ulong)(uint)ci->clientnum,ftb);
      printf("%s(%d): %s\r\n",ci->name,(ulong)(uint)ci->clientnum,ftb);
    }
  }
  return false;
}

Assistant:

bool QServ::handleTextCommands(clientinfo *ci, char *text) {
        setSender(ci->clientnum);
        setlastCI(ci);
        
        char ftb[1024] = {0};
        
        sprintf(ftb, "%s", text);
        setFullText(ftb);
        
        if(isCommand(text)) {
            char *args[20];
            
            
            int argc = 0;
            char *token = 0;
            
            token = strtok(text, " ");
            while(token != NULL) {
                args[argc] = token;
                token = strtok(NULL, " ");
                argc++;
            }
            
            int command = getCommand(0, args);
            out(ECHO_CONSOLE, "%s issued: %s",colorname(ci), getFullText());
            if(command >= 0) {
                
                char fulltext[1024];
                for(int j = 0; j <= strlen(ftb); j++) {
                    fulltext[j] = ftb[j+strlen(args[0])+1];
                }
                setFullText(fulltext);
                
                bool fargs = false;
                if(ci->privilege >= getCommandPriv(command)) {
                    if(commandHasArgs(command)) {
                        if(getCommandArgCount(command) == argc) {
                            fargs = true;
                        } else {
                            fargs = false;
                        }
                    } else {
                        fargs = true;
                    }
                    
                    setlastSA(fargs);
                    exeCommand(command, args, argc);
                    return false;
                } else {
                    sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3Insufficient permission");
                    return false;
                }
            } else {
                sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3Error: Command not found. Use \f2\"#help\" \f3for a list of commands.");
                return false;
            }
        } else {
            
            if(strlen(ftb) < 1024 && irc.isConnected()) {
                irc.speak("%s(%d): %s\r\n", ci->name, ci->clientnum, ftb);
                printf("%s(%d): %s\r\n", ci->name, ci->clientnum, ftb);
            } else {
                //disconnect_client(ci->clientnum, DISC_OVERFLOW);
            }
            //checkoLang(ci->clientnum, text);
        }
        //memset(ftb,'\0',1000);
        
        return false;
    }